

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.h
# Opt level: O1

bool __thiscall llvm::Triple::isOSVersionLT(Triple *this,uint Major,uint Minor,uint Micro)

{
  bool bVar1;
  uint LHS [3];
  uint local_2c;
  uint local_28;
  uint local_24;
  
  getOSVersion(this,&local_2c,&local_28,&local_24);
  bVar1 = local_2c < Major;
  if ((local_2c == Major) && (bVar1 = local_28 < Minor, local_28 == Minor)) {
    bVar1 = local_24 < Micro;
  }
  return bVar1;
}

Assistant:

bool isOSVersionLT(unsigned Major, unsigned Minor = 0,
                     unsigned Micro = 0) const {
    unsigned LHS[3];
    getOSVersion(LHS[0], LHS[1], LHS[2]);

    if (LHS[0] != Major)
      return LHS[0] < Major;
    if (LHS[1] != Minor)
      return LHS[1] < Minor;
    if (LHS[2] != Micro)
      return LHS[2] < Micro;

    return false;
  }